

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O2

void split_allocation(malloc_link_t *allocation,size_t new_size)

{
  ulong uVar1;
  malloc_link_t *pmVar2;
  
  uVar1 = (allocation->header).size - new_size;
  if (0x10 < uVar1) {
    (allocation->header).size = new_size;
    pmVar2 = (malloc_link_t *)((long)&allocation->next + new_size);
    (pmVar2->header).size = uVar1 - 8;
    *(malloc_link_t **)((long)&allocation[1].header.size + new_size) = free_list;
    free_list = pmVar2;
  }
  return;
}

Assistant:

static void split_allocation(malloc_link_t *allocation, size_t new_size)
{
   size_t orig_size = allocation->header.size;
   malloc_link_t *newalloc;
   
   if (orig_size - new_size <= sizeof(malloc_link_t))
      return;

   allocation->header.size = new_size;
   newalloc = (malloc_link_t *) (((unsigned char *) &allocation->next) + new_size);
   newalloc->header.size = (orig_size - new_size) - sizeof(malloc_header_t);
   newalloc->next = free_list;
   free_list = newalloc;
}